

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O0

QString * __thiscall QFileInfo::absoluteFilePath(QFileInfo *this)

{
  QLatin1StringView latin1;
  QFileInfoPrivate *pQVar1;
  QString *in_RDI;
  QLatin1StringView QVar2;
  QFileInfoPrivate *unaff_retaddr;
  qsizetype in_stack_00000008;
  QFileInfoPrivate *d;
  char *in_stack_ffffffffffffffd8;
  QString *pQVar3;
  
  pQVar3 = in_RDI;
  pQVar1 = d_func((QFileInfo *)0x126bb8);
  if ((*(uint *)&pQVar1->field_0x1d8 >> 0x1e & 1) == 0) {
    QFileInfoPrivate::getFileName(unaff_retaddr,(FileName)((ulong)pQVar3 >> 0x20));
  }
  else {
    QVar2 = Qt::Literals::StringLiterals::operator____L1(in_stack_ffffffffffffffd8,(size_t)in_RDI);
    latin1.m_size = in_stack_00000008;
    latin1.m_data = (char *)unaff_retaddr;
    QString::QString((QString *)QVar2.m_size,latin1);
  }
  return in_RDI;
}

Assistant:

QString QFileInfo::absoluteFilePath() const
{
    Q_D(const QFileInfo);
    if (d->isDefaultConstructed)
        return ""_L1;
    return d->getFileName(QAbstractFileEngine::AbsoluteName);
}